

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

void __thiscall
HighsMipSolverData::saveReportMipSolution(HighsMipSolverData *this,double new_upper_limit)

{
  double mipsolver_objective_value;
  HighsCallback *this_00;
  FILE *file;
  HighsMipSolver *pHVar1;
  HighsObjectiveSolution record;
  value_type local_58;
  string local_38;
  
  if ((this->mipsolver->submip == false) && (new_upper_limit < this->upper_limit)) {
    this_00 = this->mipsolver->callback_;
    if (((this_00->user_callback).super__Function_base._M_manager != (_Manager_type)0x0) &&
       ((*(this_00->active).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 0x10) != 0)) {
      HighsCallback::clearHighsCallbackDataOut(this_00);
      pHVar1 = this->mipsolver;
      (pHVar1->callback_->data_out).mip_solution =
           (pHVar1->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      mipsolver_objective_value = pHVar1->solution_objective_;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Improving solution","");
      interruptFromCallbackWithData(this,4,mipsolver_objective_value,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
    }
    pHVar1 = this->mipsolver;
    if ((pHVar1->options_mip_->super_HighsOptionsStruct).mip_improving_solution_save == true) {
      local_58.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58.objective = pHVar1->solution_objective_;
      std::vector<double,_std::allocator<double>_>::operator=
                (&local_58.col_value,&pHVar1->solution_);
      std::vector<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_>::push_back
                (&this->mipsolver->saved_objective_and_solution_,&local_58);
      if (local_58.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.col_value.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      pHVar1 = this->mipsolver;
    }
    file = pHVar1->improving_solution_file_;
    if (file != (FILE *)0x0) {
      writeLpObjective(file,&(pHVar1->options_mip_->super_HighsOptionsStruct).log_options,
                       pHVar1->orig_model_,&pHVar1->solution_);
      pHVar1 = this->mipsolver;
      writePrimalSolution(file,&(pHVar1->options_mip_->super_HighsOptionsStruct).log_options,
                          pHVar1->orig_model_,&pHVar1->solution_,
                          (pHVar1->options_mip_->super_HighsOptionsStruct).
                          mip_improving_solution_report_sparse);
    }
  }
  return;
}

Assistant:

void HighsMipSolverData::saveReportMipSolution(const double new_upper_limit) {
  const bool non_improving = new_upper_limit >= upper_limit;
  if (mipsolver.submip) return;
  if (non_improving) return;

  if (mipsolver.callback_->user_callback) {
    if (mipsolver.callback_->active[kCallbackMipImprovingSolution]) {
      mipsolver.callback_->clearHighsCallbackDataOut();
      mipsolver.callback_->data_out.mip_solution = mipsolver.solution_.data();
      const bool interrupt = interruptFromCallbackWithData(
          kCallbackMipImprovingSolution, mipsolver.solution_objective_,
          "Improving solution");
      assert(!interrupt);
    }
  }

  if (mipsolver.options_mip_->mip_improving_solution_save) {
    HighsObjectiveSolution record;
    record.objective = mipsolver.solution_objective_;
    record.col_value = mipsolver.solution_;
    mipsolver.saved_objective_and_solution_.push_back(record);
  }
  FILE* file = mipsolver.improving_solution_file_;
  if (file) {
    writeLpObjective(file, mipsolver.options_mip_->log_options,
                     *(mipsolver.orig_model_), mipsolver.solution_);
    writePrimalSolution(
        file, mipsolver.options_mip_->log_options, *(mipsolver.orig_model_),
        mipsolver.solution_,
        mipsolver.options_mip_->mip_improving_solution_report_sparse);
  }
}